

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs::object_method>::holder<cs_impl::any_const&,cs_impl::any&,bool>
          (holder<cs::object_method> *this,any *args,any *args_1,bool *args_2)

{
  bool bVar1;
  proxy *ppVar2;
  proxy *ppVar3;
  any local_18;
  any local_10;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0023b460;
  ppVar2 = args->mDat;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  ppVar3 = args_1->mDat;
  if (ppVar3 != (proxy *)0x0) {
    ppVar3->refcount = ppVar3->refcount + 1;
  }
  bVar1 = *args_2;
  (this->mDat).object.mDat = ppVar2;
  local_10.mDat = (proxy *)0x0;
  (this->mDat).callable.mDat = ppVar3;
  local_18.mDat = (proxy *)0x0;
  (this->mDat).is_request_fold = bVar1;
  recycle(&local_18);
  recycle(&local_10);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}